

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::Type> *
wasm::WATParser::anon_unknown_11::
valtype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  ParseInput *this;
  bool bVar1;
  bool bVar2;
  Nullability extraout_EDX;
  Nullability extraout_EDX_00;
  Nullability nullability;
  Nullability extraout_EDX_01;
  Nullability extraout_EDX_02;
  Nullability extraout_EDX_03;
  Nullability extraout_EDX_04;
  Nullability nullability_00;
  HeapTypeT ht;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx> *pTStack_100;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  Result<wasm::HeapType> type_1;
  Result<wasm::HeapType> _val;
  MaybeResult<wasm::Type> type;
  
  this = &ctx->in;
  expected._M_str = "i32";
  expected._M_len = 3;
  bVar1 = ParseInput::takeKeyword(this,expected);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 2;
LAB_00a7ebcc:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  expected_00._M_str = "i64";
  expected_00._M_len = 3;
  bVar1 = ParseInput::takeKeyword(this,expected_00);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 3;
    goto LAB_00a7ebcc;
  }
  expected_01._M_str = "f32";
  expected_01._M_len = 3;
  bVar1 = ParseInput::takeKeyword(this,expected_01);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 4;
    goto LAB_00a7ebcc;
  }
  expected_02._M_str = "f64";
  expected_02._M_len = 3;
  bVar1 = ParseInput::takeKeyword(this,expected_02);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 5;
    goto LAB_00a7ebcc;
  }
  expected_03._M_str = "v128";
  expected_03._M_len = 4;
  bVar1 = ParseInput::takeKeyword(this,expected_03);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 6;
    goto LAB_00a7ebcc;
  }
  expected_04._M_str = "funcref";
  expected_04._M_len = 7;
  bVar1 = ParseInput::takeKeyword(this,expected_04);
  if (bVar1) {
    pTStack_100 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx> *)0x1;
    nullability = extraout_EDX;
  }
  else {
    expected_05._M_str = "externref";
    expected_05._M_len = 9;
    bVar1 = ParseInput::takeKeyword(this,expected_05);
    if (bVar1) {
      pTStack_100 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx> *)
                    0x0;
      nullability = extraout_EDX_00;
    }
    else {
      expected_06._M_str = "anyref";
      expected_06._M_len = 6;
      bVar1 = ParseInput::takeKeyword(this,expected_06);
      if (bVar1) {
        pTStack_100 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx> *)
                      0x2;
        nullability = extraout_EDX_01;
      }
      else {
        expected_07._M_str = "eqref";
        expected_07._M_len = 5;
        bVar1 = ParseInput::takeKeyword(this,expected_07);
        if (bVar1) {
          pTStack_100 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                         *)0x3;
          nullability = extraout_EDX_02;
        }
        else {
          expected_08._M_str = "i31ref";
          expected_08._M_len = 6;
          bVar1 = ParseInput::takeKeyword(this,expected_08);
          if (bVar1) {
            pTStack_100 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                           *)0x4;
            nullability = extraout_EDX_03;
          }
          else {
            expected_09._M_str = "structref";
            expected_09._M_len = 9;
            bVar1 = ParseInput::takeKeyword(this,expected_09);
            if (!bVar1) {
              expected_10._M_str = "arrayref";
              expected_10._M_len = 8;
              bVar1 = ParseInput::takeKeyword(this,expected_10);
              if (bVar1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)
                           ((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20),"arrayref not yet supported",(allocator<char> *)&local_d0);
                ParseInput::err((Err *)local_b0,this,
                                (string *)
                                ((long)&type_1.val.
                                        super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                + 0x20));
                std::__detail::__variant::
                _Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>::
                _Variant_storage<2ul,wasm::WATParser::Err>
                          ((_Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>
                            *)((long)&_val.val.
                                      super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                      .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                              0x20),local_b0);
                std::__cxx11::string::~string((string *)local_b0);
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20));
              }
              else {
                expected_11._M_str = "ref";
                expected_11._M_len = 3;
                bVar1 = ParseInput::takeSExprStart(this,expected_11);
                if (bVar1) {
                  expected_12._M_str = "null";
                  expected_12._M_len = 4;
                  bVar1 = ParseInput::takeKeyword(this,expected_12);
                  heaptype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                            ((Result<wasm::HeapType> *)local_b0,ctx);
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::_Copy_ctor_base
                            ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                             ((long)&type_1.val.
                                     super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                             0x20),(_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                                   local_b0);
                  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_
                      == '\x01') {
                    std::__cxx11::string::string
                              ((string *)&local_d0,
                               (string *)
                               ((long)&type_1.val.
                                       super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                               + 0x20));
                    std::__detail::__variant::
                    _Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>::
                    _Variant_storage<2ul,wasm::WATParser::Err>
                              ((_Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>
                                *)((long)&_val.val.
                                          super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                          .
                                          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                          .
                                          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                  + 0x20),&local_d0);
                    std::__cxx11::string::~string((string *)&local_d0);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                               ((long)&type_1.val.
                                       super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                               + 0x20));
                  }
                  else {
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                               ((long)&type_1.val.
                                       super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                               + 0x20));
                    bVar2 = ParseInput::takeRParen(this);
                    if (bVar2) {
                      ht.id._1_7_ = 0;
                      ht.id._0_1_ = bVar1;
                      _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                           TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                           ::makeRefType((TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                                          *)local_b0,ht,nullability_00);
                      type.val.
                      super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._24_1_ = 0;
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_d0,"expected end of reftype",
                                 (allocator<char> *)
                                 ((long)&type.val.
                                         super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 + 0x27));
                      ParseInput::err((Err *)((long)&type_1.val.
                                                                                                          
                                                  super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                             + 0x20),this,&local_d0);
                      std::__detail::__variant::
                      _Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>
                      ::_Variant_storage<2ul,wasm::WATParser::Err>
                                ((_Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>
                                  *)((long)&_val.val.
                                            super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                    + 0x20),
                                 (__index_type *)
                                 ((long)&type_1.val.
                                         super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                 + 0x20));
                      std::__cxx11::string::~string
                                ((string *)
                                 ((long)&type_1.val.
                                         super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                 + 0x20));
                      std::__cxx11::string::~string((string *)&local_d0);
                    }
                  }
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                             local_b0);
                }
                else {
                  type.val.
                  super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                  ._M_u._24_1_ = 1;
                }
              }
              goto LAB_00a7ec2f;
            }
            pTStack_100 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                           *)0x5;
            nullability = extraout_EDX_04;
          }
        }
      }
    }
  }
  _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
       TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>::makeRefType
                 (pTStack_100,(HeapTypeT)0x1,nullability);
  type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u._24_1_
       = 0;
LAB_00a7ec2f:
  if (type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u.
      _24_1_ == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"expected valtype",
               (allocator<char> *)
               ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
    ParseInput::err((Err *)local_b0,this,&local_f0);
    std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::Type,wasm::WATParser::Err> *)__return_storage_ptr__,
               local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err> *)
               local_b0,(_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&_val.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20));
    if (type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                 (string *)local_b0);
      std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::WATParser::Err>::
      _Variant_storage<1ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::Type,wasm::WATParser::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_b0);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_b0);
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> =
           _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x20) = '\0';
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                     *)((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20))
  ;
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> valtype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = reftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}